

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

Vec_Int_t * Gia_ManRequiredLevel(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  pVVar2 = Gia_ManReverseLevel(p);
  lVar4 = (long)p->vCis->nSize;
  if (lVar4 < 1) {
    iVar3 = 0;
  }
  else {
    lVar7 = 0;
    iVar3 = 0;
    do {
      iVar1 = p->vCis->pArray[lVar7];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (pVVar2->nSize <= iVar1) goto LAB_0073f156;
      if (iVar3 <= pVVar2->pArray[iVar1]) {
        iVar3 = pVVar2->pArray[iVar1];
      }
      lVar7 = lVar7 + 1;
    } while (lVar4 != lVar7);
  }
  if ((0 < p->nObjs) && (p->pObjs != (Gia_Obj_t *)0x0)) {
    uVar6 = 0;
    uVar5 = (ulong)(uint)pVVar2->nSize;
    if (pVVar2->nSize < 1) {
      uVar5 = uVar6;
    }
    do {
      if (uVar5 == uVar6) {
LAB_0073f156:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      pVVar2->pArray[uVar6] = iVar3 - pVVar2->pArray[uVar6];
      uVar6 = uVar6 + 1;
    } while ((long)uVar6 < (long)p->nObjs);
  }
  return pVVar2;
}

Assistant:

Vec_Int_t * Gia_ManRequiredLevel( Gia_Man_t * p )  
{
    Vec_Int_t * vRequired;
    Gia_Obj_t * pObj;
    int i, LevelMax = 0;
    vRequired = Gia_ManReverseLevel( p );
    Gia_ManForEachCi( p, pObj, i )
        LevelMax = Abc_MaxInt( LevelMax, Vec_IntEntry(vRequired, Gia_ObjId(p, pObj)) );
    Gia_ManForEachObj( p, pObj, i )
        Vec_IntWriteEntry( vRequired, i, LevelMax - Vec_IntEntry(vRequired, i) );
    return vRequired;
}